

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O1

char * choc::text::FloatToStringBuffer<float>::writeWithoutExponentGreaterThan1
                 (char *dest,uint32_t totalLength,uint32_t mantissaLength,int maxDecimalPlaces,int K
                 )

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  
  if (K < 0) {
    pcVar5 = (char *)memmove(dest + mantissaLength + 1,dest + mantissaLength,
                             (ulong)(totalLength - mantissaLength));
    dest[mantissaLength] = '.';
    if (K + maxDecimalPlaces < 0) {
      iVar6 = maxDecimalPlaces + mantissaLength;
      iVar1 = mantissaLength + 1;
      bVar3 = iVar1 < iVar6;
      if (iVar1 < iVar6) {
        pcVar4 = (char *)(long)iVar6;
        if (dest[(long)pcVar4] == '0') {
          pcVar5 = pcVar4;
          do {
            pcVar4 = pcVar5 + -1;
            bVar3 = (long)iVar1 < (long)pcVar4;
            if ((long)pcVar4 <= (long)iVar1) goto LAB_001eeff1;
            pcVar2 = dest + -1 + (long)pcVar5;
            pcVar5 = pcVar4;
          } while (*pcVar2 == '0');
        }
        pcVar5 = dest + (long)pcVar4 + 1;
      }
LAB_001eeff1:
      if (!bVar3) {
        pcVar5 = dest + (mantissaLength + 2);
      }
    }
    else {
      pcVar5 = dest + (totalLength + 1);
    }
  }
  else {
    pcVar5 = dest + totalLength;
    if (totalLength < mantissaLength) {
      memset(pcVar5,0x30,(ulong)(~totalLength + mantissaLength) + 1);
      pcVar5 = pcVar5 + (ulong)(~totalLength + mantissaLength) + 1;
    }
    pcVar5[0] = '.';
    pcVar5[1] = '0';
    pcVar5 = pcVar5 + 2;
  }
  return pcVar5;
}

Assistant:

static char* writeWithoutExponentGreaterThan1 (char* dest, uint32_t totalLength, uint32_t mantissaLength, int maxDecimalPlaces, int K)
    {
        if (K >= 0)
        {
            dest += totalLength;

            for (auto i = totalLength; i < mantissaLength; ++i)
                dest = write (dest, '0');

            return write (dest, '.', '0');
        }

        insertChar (dest + mantissaLength, totalLength - mantissaLength, '.', 1);

        if (K + maxDecimalPlaces >= 0)
            return dest + (totalLength + 1);

        for (auto i = static_cast<int> (mantissaLength) + maxDecimalPlaces; i > static_cast<int> (mantissaLength + 1); --i)
            if (dest[i] != '0')
                return dest + (i + 1);

        return dest + (mantissaLength + 2);
    }